

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_update
          (tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          iterator keyed_position,unsigned_long *value,time_point expire_time)

{
  pointer ppVar1;
  reference e_00;
  iterator iVar2;
  element *e;
  size_t element_idx;
  unsigned_long *value_local;
  tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  iterator keyed_position_local;
  
  element_idx = (size_t)value;
  value_local = (unsigned_long *)this;
  this_local = (tlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
                *)expire_time.__d.__r;
  expire_time_local.__d.__r =
       (duration)
       (duration)
       keyed_position.
       super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur;
  ppVar1 = std::__detail::
           _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>::operator->
                     ((_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false> *
                      )&expire_time_local);
  e = (element *)ppVar1->second;
  e_00 = std::
         vector<cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
         ::operator[]((vector<cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::tlru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::element>_>
                       *)(this + 0x30),(size_type)e);
  (e_00->m_expire_time).__d.__r = (rep)this_local;
  e_00->m_value = *(unsigned_long *)element_idx;
  std::
  multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
  ::erase_abi_cxx11_((multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)(this + 0x98),(e_00->m_ttl_position)._M_node);
  iVar2 = std::
          multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
          ::
          emplace<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,unsigned_long&>
                    ((multimap<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,unsigned_long,std::less<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>const,unsigned_long>>>
                      *)(this + 0x98),
                     (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&this_local,(unsigned_long *)&e);
  (e_00->m_ttl_position)._M_node = iVar2._M_node;
  do_access(this,e_00);
  return;
}

Assistant:

auto do_update(
        typename std::unordered_map<key_type, size_t>::iterator keyed_position,
        value_type&&                                            value,
        std::chrono::steady_clock::time_point                   expire_time) -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // Reinsert into TTL list with the new TTL.
        m_ttl_list.erase(e.m_ttl_position);
        e.m_ttl_position = m_ttl_list.emplace(expire_time, element_idx);

        do_access(e);
    }